

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlCheckFilename(char *path)

{
  int iVar1;
  int iVar2;
  stat stat_buffer;
  stat64 sStack_98;
  
  iVar2 = 0;
  if (path != (char *)0x0) {
    iVar1 = stat64(path,&sStack_98);
    iVar2 = 0;
    if (-1 < iVar1) {
      iVar2 = ((sStack_98.st_mode & 0xf000) == 0x4000) + 1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlCheckFilename(const char *path)
{
#if defined(_MSC_VER) && _MSC_VER >= 1500
    struct _stat64 stat_buffer;
#else
    struct stat stat_buffer;
#endif
    int res;

    if (path == NULL)
	return(0);

#if defined(_WIN32)
    {
        wchar_t *wpath;

        /*
         * On Windows stat and wstat do not work with long pathname,
         * which start with '\\?\'
         */
        if ((path[0] == '\\') && (path[1] == '\\') && (path[2] == '?') &&
            (path[3] == '\\') )
                return 1;

        wpath = __xmlIOWin32UTF8ToWChar(path);
        if (wpath == NULL)
            return(0);
#if defined(_MSC_VER) && _MSC_VER >= 1500
        res = _wstat64(wpath, &stat_buffer);
#else
        res = _wstat(wpath, &stat_buffer);
#endif
        xmlFree(wpath);
    }
#else
    res = stat(path, &stat_buffer);
#endif

    if (res < 0)
        return 0;

#ifdef S_ISDIR
    if (S_ISDIR(stat_buffer.st_mode))
        return 2;
#endif

    return 1;
}